

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void glcts::anon_unknown_0::ShaderSourceFactory::streamSubroutineValidator
               (ostringstream *ret,SubroutineUniform *subroutineUniform,GLenum shader,
               char *outTemporary)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  SubroutineFunction *this;
  UniformValue *this_00;
  int local_2c;
  int arrayElem;
  char *outTemporary_local;
  GLenum shader_local;
  SubroutineUniform *subroutineUniform_local;
  ostringstream *ret_local;
  
  bVar1 = DefOccurence::occurs(&subroutineUniform->defOccurence,shader);
  if ((bVar1) && ((subroutineUniform->used & 1U) != 0)) {
    for (local_2c = 0; local_2c < subroutineUniform->arraySize; local_2c = local_2c + 1) {
      poVar2 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                               "\n    if (any(greaterThan(abs(");
      psVar3 = glcts::(anonymous_namespace)::SubroutineUniform::getName_abi_cxx11_
                         ((SubroutineUniform *)subroutineUniform);
      std::operator<<(poVar2,(string *)psVar3);
      SubroutineUniform::streamArrayStr(subroutineUniform,ret,local_2c);
      std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"(zero) - ");
      this = SubroutineUniform::getSelectedFunction(subroutineUniform,local_2c);
      this_00 = SubroutineFunction::getRetVal(this);
      UniformValue::streamValue(this_00,ret,0,0);
      std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"), vec4(0.1)))) {");
      poVar2 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n       ")
      ;
      poVar2 = std::operator<<(poVar2,outTemporary);
      std::operator<<(poVar2," = vec4 (1.0, 0.0, 0.0, 1.0);");
      std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n    }");
    }
  }
  return;
}

Assistant:

static void streamSubroutineValidator(std::ostringstream& ret, const SubroutineUniform& subroutineUniform,
										  GLenum shader, const char* outTemporary)
	{
		if (subroutineUniform.defOccurence.occurs(shader) && subroutineUniform.used)
		{
			for (int arrayElem = 0; arrayElem < subroutineUniform.arraySize; arrayElem++)
			{
				ret << NL "    if (any(greaterThan(abs(" << subroutineUniform.getName();
				subroutineUniform.streamArrayStr(ret, arrayElem);
				ret << "(zero) - ";
				subroutineUniform.getSelectedFunction(arrayElem).getRetVal().streamValue(ret);
				ret << "), vec4(0.1)))) {";
				ret << NL "       " << outTemporary << " = vec4 (1.0, 0.0, 0.0, 1.0);";
				ret << NL "    }";
			}
		}
	}